

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

QModelIndex * __thiscall
QTableView::moveCursor
          (QModelIndex *__return_storage_ptr__,QTableView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QPersistentModelIndex *this_00;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  Representation RVar10;
  uint visualIndex;
  LayoutDirection LVar11;
  int iVar12;
  uint uVar13;
  uint row;
  Span *pSVar14;
  QPoint QVar15;
  long lVar16;
  QSpanCollection *pQVar17;
  int extraout_var;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int extraout_var_00;
  int iVar21;
  uint uVar22;
  uint uVar23;
  QAbstractItemModel *pQVar24;
  int iVar25;
  QTableViewPrivate *pQVar26;
  QTableViewPrivate *this_02;
  SearchDirection searchDirection;
  bool bVar27;
  uint uVar28;
  CursorAction CVar29;
  long in_FS_OFFSET;
  int originalRow;
  int originalColumn;
  QModelIndex local_88;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  uVar7 = (**(code **)(*(long *)pQVar24 + 0x78))(pQVar24,&local_58);
  do {
    uVar28 = uVar7;
    uVar7 = uVar28 - 1;
    if ((int)uVar28 < 1) break;
    iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar7);
    bVar3 = QHeaderView::isSectionHidden
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
  } while (bVar3);
  pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  uVar9 = (**(code **)(*(long *)pQVar24 + 0x80))(pQVar24,&local_58);
  do {
    uVar23 = uVar9;
    if ((int)uVar23 < 1) break;
    iVar8 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar23 - 1);
    bVar3 = QHeaderView::isSectionHidden
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x580),iVar8);
    uVar9 = uVar23 - 1;
  } while (bVar3);
  uVar9 = uVar23 - 1;
  if ((uVar7 == 0xffffffff) || (uVar23 == 0)) goto LAB_005932dc;
  local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_88,(QAbstractItemView *)this);
  if ((local_88.r < 0) ||
     (((long)local_88._0_8_ < 0 || (local_88.m.ptr == (QAbstractItemModel *)0x0)))) {
    uVar18 = 0;
    if (1 < (int)uVar23) {
      uVar18 = 0;
      do {
        iVar8 = QHeaderView::logicalIndex(this_01->horizontalHeader,(int)uVar18);
        bVar3 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),iVar8);
        if (!bVar3) break;
        uVar28 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar28;
      } while (uVar23 - 1 != uVar28);
    }
    QVar15 = (QPoint)(uVar18 | 0xffffffff00000000);
    iVar8 = -1;
    do {
      QVar15 = (QPoint)((long)QVar15 + 0x100000000);
      iVar8 = iVar8 + 1;
      iVar12 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
      bVar3 = QHeaderView::isSectionHidden
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x588),iVar12);
      if (!bVar3) break;
    } while (iVar8 < (int)uVar7);
    this_01->visualCursor = QVar15;
    pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar12 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    iVar8 = QHeaderView::logicalIndex(this_01->horizontalHeader,(int)uVar18);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar16 = *(long *)pQVar24;
    goto LAB_005933e7;
  }
  QVar15.xp.m_i = QHeaderView::visualIndex(this_01->horizontalHeader,local_88.c);
  RVar10.m_i = QHeaderView::visualIndex(this_01->verticalHeader,local_88.r);
  iVar8 = (this_01->visualCursor).xp.m_i;
  iVar12 = (this_01->visualCursor).yp.m_i;
  if (RVar10.m_i != iVar12 || QVar15.xp.m_i != iVar8) {
    if ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_01->spans) {
      iVar25 = local_88.r;
      iVar21 = local_88.c;
      pSVar14 = QSpanCollection::spanAt(&this_01->spans,local_88.c,local_88.r);
      iVar20 = iVar25;
      iVar19 = iVar21;
      if (pSVar14 != (Span *)0x0) {
        iVar25 = pSVar14->m_top;
        iVar21 = pSVar14->m_left;
        iVar20 = pSVar14->m_bottom;
        iVar19 = pSVar14->m_right;
      }
      if ((((iVar25 <= iVar12) && (iVar12 <= iVar20)) && (iVar21 <= iVar8)) && (iVar8 <= iVar19))
      goto LAB_00593275;
    }
    QVar15.yp.m_i = RVar10.m_i;
    this_01->visualCursor = QVar15;
  }
LAB_00593275:
  row = (this_01->visualCursor).yp.m_i;
  if ((int)uVar28 <= (int)row) {
    row = uVar7;
  }
  visualIndex = (this_01->visualCursor).xp.m_i;
  if ((int)uVar23 <= (int)visualIndex) {
    visualIndex = uVar9;
  }
  LVar11 = QWidget::layoutDirection((QWidget *)this);
  CVar29 = cursorAction;
  if (((LVar11 == RightToLeft) && (CVar29 = MoveRight, cursorAction != MoveLeft)) &&
     (CVar29 = MoveLeft, cursorAction != MoveRight)) {
    CVar29 = cursorAction;
  }
  uVar13 = row;
  switch(CVar29) {
  case MoveUp:
    iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,row);
    iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
    uVar7 = row;
    if ((iVar8 != -1) &&
       ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_01->spans)) {
      pSVar14 = QSpanCollection::spanAt(&this_01->spans,iVar12,iVar8);
      iVar21 = iVar12;
      iVar25 = iVar8;
      if (pSVar14 != (Span *)0x0) {
        iVar25 = pSVar14->m_top;
        iVar21 = pSVar14->m_left;
        iVar8 = pSVar14->m_bottom;
        iVar12 = pSVar14->m_right;
      }
      if ((1 < (iVar12 - iVar21) + 1) || (1 < (iVar8 - iVar25) + 1)) {
        uVar7 = QHeaderView::visualIndex(this_01->verticalHeader,iVar25);
      }
    }
    uVar28 = uVar7;
    if (-1 < (int)uVar7) {
      uVar28 = uVar7 - 1;
      iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar28);
      iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
      if (iVar8 != -1) {
        do {
          bVar3 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
          if (bVar3) {
            if ((int)uVar7 < 1) goto LAB_00593ecf;
          }
          else {
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
            (**(code **)(*(long *)pQVar24 + 0x60))(&local_58,pQVar24,iVar8,iVar12,&local_70);
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            uVar18 = (**(code **)(*(long *)pQVar24 + 0x138))(pQVar24,&local_58);
            if (((uVar18 & 0x20) != 0) || ((int)uVar7 < 1)) break;
          }
          uVar28 = uVar28 - 1;
          iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar7 - 2);
          iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
          uVar7 = uVar7 - 1;
        } while (iVar8 != -1);
        uVar28 = uVar7 - 1;
      }
    }
LAB_00593ecf:
    if (-1 < (int)uVar28) {
      row = uVar28;
    }
  default:
switchD_0059343e_default:
    uVar18 = (ulong)visualIndex;
    uVar13 = row;
    break;
  case MoveDown:
    pQVar26 = (QTableViewPrivate *)&this_01->spans;
    uVar7 = row;
    if ((QTableViewPrivate *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar26) {
      iVar12 = local_88.r;
      this_02 = pQVar26;
      pSVar14 = QSpanCollection::spanAt((QSpanCollection *)pQVar26,local_88.c,local_88.r);
      iVar8 = iVar12;
      if (pSVar14 != (Span *)0x0) {
        iVar8 = pSVar14->m_top;
        iVar12 = pSVar14->m_bottom;
      }
      iVar8 = QTableViewPrivate::sectionSpanEndLogical
                        (this_02,this_01->verticalHeader,iVar8,(iVar12 - iVar8) + 1);
      uVar7 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
    }
    iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar7);
    iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
    if ((iVar8 != -1) &&
       ((QTableViewPrivate *)
        (((QSpanCollection *)pQVar26)->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar26)) {
      pSVar14 = QSpanCollection::spanAt((QSpanCollection *)pQVar26,iVar12,iVar8);
      iVar21 = iVar12;
      iVar25 = iVar8;
      if (pSVar14 != (Span *)0x0) {
        iVar25 = pSVar14->m_top;
        iVar21 = pSVar14->m_left;
        iVar8 = pSVar14->m_bottom;
        iVar12 = pSVar14->m_right;
      }
      if ((1 < (iVar12 - iVar21) + 1) || (1 < (iVar8 - iVar25) + 1)) {
        iVar8 = QTableViewPrivate::sectionSpanEndLogical
                          (pQVar26,this_01->verticalHeader,iVar25,(iVar8 - iVar25) + 1);
        uVar7 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
      }
    }
    if ((int)uVar7 < (int)uVar28) {
      uVar7 = uVar7 + 1;
      iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar7);
      iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
      while (iVar8 != -1) {
        bVar3 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
        if (!bVar3) {
          pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
          (**(code **)(*(long *)pQVar24 + 0x60))(&local_58,pQVar24,iVar8,iVar12,&local_70);
          pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
          uVar18 = (**(code **)(*(long *)pQVar24 + 0x138))(pQVar24,&local_58);
          if ((uVar18 & 0x20) != 0) break;
        }
        if ((int)uVar28 <= (int)uVar7) break;
        uVar7 = uVar7 + 1;
        iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar7);
        iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,visualIndex);
      }
    }
    if ((int)uVar7 < (int)uVar28) {
      row = uVar7;
    }
    goto switchD_0059343e_default;
  case MoveLeft:
  case MovePrevious:
    pQVar17 = &this_01->spans;
    bVar2 = 1;
    bVar27 = false;
    bVar3 = false;
    uVar28 = visualIndex;
    do {
      iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar13);
      iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar28);
      if ((iVar12 != -1 && !(bool)(~bVar2 & 1)) &&
         ((QSpanCollection *)
          (pQVar17->spans).
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next != pQVar17)) {
        pSVar14 = QSpanCollection::spanAt(pQVar17,iVar12,iVar8);
        iVar21 = iVar12;
        iVar25 = iVar8;
        if (pSVar14 != (Span *)0x0) {
          iVar25 = pSVar14->m_top;
          iVar21 = pSVar14->m_left;
          iVar8 = pSVar14->m_bottom;
          iVar12 = pSVar14->m_right;
        }
        if ((1 < (iVar12 - iVar21) + 1) || (1 < (iVar8 - iVar25) + 1)) {
          uVar28 = QHeaderView::visualIndex(this_01->horizontalHeader,iVar21);
        }
        bVar2 = 0;
      }
      uVar9 = uVar28;
      if (-1 < (int)uVar28) {
        do {
          uVar9 = uVar28 - 1;
          iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar13);
          iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar9);
          if ((iVar8 == -1) || (iVar12 == -1)) goto LAB_00593645;
          bVar4 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
          if ((!bVar4) &&
             (bVar4 = QHeaderView::isSectionHidden
                                (*(QHeaderView **)
                                  (*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580),iVar12), !bVar4)) {
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
            (**(code **)(*(long *)pQVar24 + 0x60))(&local_58,pQVar24,iVar8,iVar12,&local_70);
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            uVar18 = (**(code **)(*(long *)pQVar24 + 0x138))(pQVar24,&local_58);
            if ((uVar18 & 0x20) != 0) goto LAB_00593645;
          }
          if (bVar3) {
            if (((int)row < (int)uVar13) || (row == uVar13 && (int)visualIndex < (int)uVar28)) {
              bVar27 = true;
              goto LAB_00593645;
            }
          }
          bVar4 = 0 < (int)uVar28;
          uVar28 = uVar9;
        } while (bVar4);
        uVar9 = 0xffffffff;
      }
LAB_00593645:
      uVar22 = uVar13 - 1;
      if (uVar13 == 0) {
        uVar22 = uVar7;
      }
      if (-1 < (int)uVar9 || CVar29 == MoveLeft) break;
      if (uVar13 == 0) {
        bVar3 = true;
      }
      uVar28 = uVar23;
      uVar13 = uVar22;
      uVar9 = uVar23;
    } while (!bVar27);
    if (-1 < (int)uVar9) {
      visualIndex = uVar9;
    }
    uVar18 = (ulong)visualIndex;
    break;
  case MoveRight:
  case MoveNext:
    pQVar17 = &this_01->spans;
    bVar2 = 1;
    bVar27 = false;
    bVar3 = false;
    uVar28 = visualIndex;
    do {
      iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar13);
      iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar28);
      if ((iVar12 != -1 && !(bool)(~bVar2 & 1)) &&
         ((QSpanCollection *)
          (pQVar17->spans).
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next != pQVar17)) {
        pQVar26 = (QTableViewPrivate *)pQVar17;
        pSVar14 = QSpanCollection::spanAt(pQVar17,iVar12,iVar8);
        iVar21 = iVar12;
        iVar25 = iVar8;
        if (pSVar14 != (Span *)0x0) {
          iVar25 = pSVar14->m_top;
          iVar21 = pSVar14->m_left;
          iVar8 = pSVar14->m_bottom;
          iVar12 = pSVar14->m_right;
        }
        iVar12 = (iVar12 - iVar21) + 1;
        if ((iVar12 < 2) && ((iVar8 - iVar25) + 1 < 2)) {
          bVar2 = 0;
        }
        else {
          iVar8 = QTableViewPrivate::sectionSpanEndLogical
                            (pQVar26,this_01->horizontalHeader,iVar21,iVar12);
          uVar28 = QHeaderView::visualIndex(this_01->horizontalHeader,iVar8);
          bVar2 = 0;
        }
      }
      if ((int)uVar28 < (int)uVar23) {
        while( true ) {
          uVar9 = uVar28;
          uVar28 = uVar9 + 1;
          iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar13);
          iVar12 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar28);
          bVar4 = bVar27;
          if ((iVar8 == -1) || (iVar12 == -1)) break;
          bVar5 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
          if ((!bVar5) &&
             (bVar5 = QHeaderView::isSectionHidden
                                (*(QHeaderView **)
                                  (*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580),iVar12), !bVar5)) {
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
            (**(code **)(*(long *)pQVar24 + 0x60))(&local_58,pQVar24,iVar8,iVar12,&local_70);
            pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
            uVar18 = (**(code **)(*(long *)pQVar24 + 0x138))(pQVar24,&local_58);
            if ((uVar18 & 0x20) != 0) break;
          }
          if (bVar3) {
            bVar4 = true;
            if (((int)uVar13 < (int)row) || (row == uVar13 && (int)uVar9 < (int)visualIndex)) break;
          }
          bVar4 = bVar27;
          if ((int)uVar23 <= (int)uVar28) break;
        }
        bVar27 = bVar4;
        uVar28 = uVar9 + 1;
      }
      uVar9 = uVar13 + 1;
      if (uVar13 == uVar7) {
        uVar9 = 0;
      }
      if ((int)uVar28 < (int)uVar23 || CVar29 == MoveRight) break;
      uVar28 = 0xffffffff;
      if (uVar13 == uVar7) {
        bVar3 = true;
      }
      uVar13 = uVar9;
    } while (!bVar27);
    uVar18 = (ulong)visualIndex;
    if ((int)uVar28 < (int)uVar23) {
      uVar18 = (ulong)uVar28;
    }
    break;
  case MoveHome:
    uVar28 = QTableViewPrivate::nextActiveVisualColumn(this_01,row,0,uVar9,Increasing);
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      uVar23 = 0;
      searchDirection = Increasing;
      uVar9 = uVar7;
LAB_00593e5b:
      row = QTableViewPrivate::nextActiveVisualRow(this_01,uVar23,uVar28,uVar9,searchDirection);
    }
    goto LAB_00593e62;
  case MoveEnd:
    uVar28 = QTableViewPrivate::nextActiveVisualColumn(this_01,row,uVar9,-1,Decreasing);
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      searchDirection = Decreasing;
      uVar9 = 0xffffffff;
      uVar23 = uVar7;
      goto LAB_00593e5b;
    }
LAB_00593e62:
    uVar18 = (ulong)uVar28;
    uVar13 = row;
    break;
  case MovePageUp:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_88);
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar8 = QHeaderView::logicalIndexAt
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),
                       ~(pQVar1->crect).y2.m_i + extraout_var_00 + (pQVar1->crect).y1.m_i);
    if (iVar8 == -1) {
      iVar8 = 0;
    }
    else {
      iVar8 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
    }
    iVar8 = QTableViewPrivate::nextActiveVisualRow(this_01,iVar8,local_88.c,uVar7,Increasing);
    iVar12 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar8 = local_88.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar16 = *(long *)pQVar24;
    goto LAB_005933e7;
  case MovePageDown:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_88);
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar8 = QHeaderView::logicalIndexAt
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),
                       ((extraout_var + (pQVar1->crect).y2.m_i) - (pQVar1->crect).y1.m_i) + 1);
    if (iVar8 != -1) {
      uVar7 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
    }
    iVar8 = QTableViewPrivate::nextActiveVisualRow(this_01,uVar7,local_88.c,-1,Decreasing);
    iVar12 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar8 = local_88.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar16 = *(long *)pQVar24;
LAB_005933e7:
    (**(code **)(lVar16 + 0x60))(__return_storage_ptr__,pQVar24,iVar12,iVar8,&local_58);
    goto LAB_005933ed;
  }
  this_01->visualCursor = (QPoint)(uVar18 | (ulong)uVar13 << 0x20);
  iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,uVar13);
  uVar7 = QHeaderView::logicalIndex(this_01->horizontalHeader,(int)uVar18);
  pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  cVar6 = QAbstractItemModel::hasIndex((int)pQVar24,iVar8,(QModelIndex *)(ulong)uVar7);
  if (cVar6 != '\0') {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar24 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
    (**(code **)(*(long *)pQVar24 + 0x60))(&local_58,pQVar24,iVar8,uVar7,&local_70);
    bVar3 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar8);
    if (((!bVar3) && (bVar3 = QHeaderView::isSectionHidden(this_01->horizontalHeader,uVar7), !bVar3)
        ) && (pQVar24 = (this_01->super_QAbstractItemViewPrivate).model,
             uVar18 = (**(code **)(*(long *)pQVar24 + 0x138))(pQVar24,&local_58),
             (uVar18 & 0x20) != 0)) {
      if ((QSpanCollection *)
          (this_01->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next != &this_01->spans) {
        iVar8 = local_58.r;
        iVar12 = local_58.c;
        pSVar14 = QSpanCollection::spanAt(&this_01->spans,local_58.c,local_58.r);
        iVar21 = iVar12;
        iVar25 = iVar8;
        if (pSVar14 != (Span *)0x0) {
          iVar25 = pSVar14->m_top;
          iVar21 = pSVar14->m_left;
          iVar8 = pSVar14->m_bottom;
          iVar12 = pSVar14->m_right;
        }
        if ((1 < (iVar12 - iVar21) + 1) || (1 < (iVar8 - iVar25) + 1)) {
          (**(code **)(*(long *)(this_01->super_QAbstractItemViewPrivate).model + 0x70))(&local_70);
          local_58.m.ptr = local_70.m.ptr;
          local_58.r = local_70.r;
          local_58.c = local_70.c;
          local_58.i = local_70.i;
        }
      }
      (__return_storage_ptr__->m).ptr = local_58.m.ptr;
      __return_storage_ptr__->r = local_58.r;
      __return_storage_ptr__->c = local_58.c;
      *(undefined4 *)&__return_storage_ptr__->i = (undefined4)local_58.i;
      *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = local_58.i._4_4_;
      goto LAB_005933ed;
    }
  }
LAB_005932dc:
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_005933ed:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTableView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTableView);
    Q_UNUSED(modifiers);

    int bottom = d->model->rowCount(d->root) - 1;
    // make sure that bottom is the bottommost *visible* row
    while (bottom >= 0 && isRowHidden(d->logicalRow(bottom)))
        --bottom;

    int right = d->model->columnCount(d->root) - 1;

    while (right >= 0 && isColumnHidden(d->logicalColumn(right)))
        --right;

    if (bottom == -1 || right == -1)
        return QModelIndex(); // model is empty

    QModelIndex current = currentIndex();

    if (!current.isValid()) {
        int row = 0;
        int column = 0;
        while (column < right && isColumnHidden(d->logicalColumn(column)))
            ++column;
        while (isRowHidden(d->logicalRow(row)) && row < bottom)
            ++row;
        d->visualCursor = QPoint(column, row);
        return d->model->index(d->logicalRow(row), d->logicalColumn(column), d->root);
    }

    // Update visual cursor if current index has changed.
    QPoint visualCurrent(d->visualColumn(current.column()), d->visualRow(current.row()));
    if (visualCurrent != d->visualCursor) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            if (span.top() > d->visualCursor.y() || d->visualCursor.y() > span.bottom()
                || span.left() > d->visualCursor.x() || d->visualCursor.x() > span.right())
                d->visualCursor = visualCurrent;
        } else {
            d->visualCursor = visualCurrent;
        }
    }

    int visualRow = d->visualCursor.y();
    if (visualRow > bottom)
        visualRow = bottom;
    Q_ASSERT(visualRow != -1);
    int visualColumn = d->visualCursor.x();
    if (visualColumn > right)
        visualColumn = right;
    Q_ASSERT(visualColumn != -1);

    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }

    switch (cursorAction) {
    case MoveUp: {
        int originalRow = visualRow;
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow == 0)
            visualRow = d->visualRow(model()->rowCount() - 1) + 1;
            // FIXME? visualRow = bottom + 1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(span.top());
        }
        while (visualRow >= 0) {
            --visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow < 0)
            visualRow = originalRow;
        break;
    }
    case MoveDown: {
        int originalRow = visualRow;
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow >= bottom)
            visualRow = -1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
        while (visualRow <= bottom) {
            ++visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow > bottom)
            visualRow = originalRow;
        break;
    }
    case MovePrevious:
    case MoveLeft: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(span.left());
            }
            while (visualColumn >= 0) {
                --visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow < visualRow || (originalRow == visualRow && originalColumn <= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveLeft || visualColumn >= 0)
                break;
            visualColumn = right + 1;
            if (visualRow == 0) {
                wrapped = true;
                visualRow = bottom;
            } else {
                --visualRow;
            }
        } while (!looped);
        if (visualColumn < 0)
            visualColumn = originalColumn;
        break;
    }
    case MoveNext:
    case MoveRight: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
            }
            while (visualColumn <= right) {
                ++visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow > visualRow || (originalRow == visualRow && originalColumn >= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveRight || visualColumn <= right)
                break;
            visualColumn = -1;
            if (visualRow == bottom) {
                wrapped = true;
                visualRow = 0;
            } else {
                ++visualRow;
            }
        } while (!looped);
        if (visualColumn > right)
            visualColumn = originalColumn;
        break;
    }
    case MoveHome:
        visualColumn = d->nextActiveVisualColumn(visualRow, 0, right,
                                                 QTableViewPrivate::SearchDirection::Increasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(0, visualColumn, bottom,
                                               QTableViewPrivate::SearchDirection::Increasing);
        break;
    case MoveEnd:
        visualColumn = d->nextActiveVisualColumn(visualRow, right, -1,
                                                 QTableViewPrivate::SearchDirection::Decreasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(bottom, visualColumn, -1,
                                               QTableViewPrivate::SearchDirection::Decreasing);
        break;
    case MovePageUp: {
        int newLogicalRow = rowAt(visualRect(current).bottom() - d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? 0 : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), bottom,
                                           QTableViewPrivate::SearchDirection::Increasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }
    case MovePageDown: {
        int newLogicalRow = rowAt(visualRect(current).top() + d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? bottom : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), -1,
                                           QTableViewPrivate::SearchDirection::Decreasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }}

    d->visualCursor = QPoint(visualColumn, visualRow);
    int logicalRow = d->logicalRow(visualRow);
    int logicalColumn = d->logicalColumn(visualColumn);
    if (!d->model->hasIndex(logicalRow, logicalColumn, d->root))
        return QModelIndex();

    QModelIndex result = d->model->index(logicalRow, logicalColumn, d->root);
    if (!d->isRowHidden(logicalRow) && !d->isColumnHidden(logicalColumn) && d->isIndexEnabled(result)) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(result.row(), result.column());
            if (span.width() > 1 || span.height() > 1) {
                result = d->model->sibling(span.top(), span.left(), result);
            }
        }
        return result;
    }

    return QModelIndex();
}